

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_item_reserve.c
# Opt level: O2

mpt_config_item * mpt_config_item_reserve(mpt_array *arr,mpt_path *path)

{
  char *pcVar1;
  size_t sVar2;
  mpt_identifier *pmVar3;
  int len;
  int iVar4;
  mpt_type_traits *pmVar5;
  ulong uVar6;
  mpt_buffer *pmVar7;
  void *pvVar8;
  int *piVar9;
  long lVar10;
  mpt_buffer *pmVar11;
  mpt_identifier *id;
  mpt_buffer *arr_00;
  
LAB_0010c190:
  pcVar1 = path->base;
  sVar2 = path->off;
  len = mpt_path_next(path);
  if (len < 0) {
    return (mpt_config_item *)0x0;
  }
  pmVar5 = mpt_config_item_traits();
  pmVar7 = (mpt_buffer *)((mpt_buffer *)arr)->_vptr;
  if (pmVar7 == (mpt_buffer *)0x0) {
    uVar6 = 0;
  }
  else {
    if (pmVar7->_content_traits != pmVar5) {
      piVar9 = __errno_location();
      *piVar9 = 0x16;
      return (mpt_config_item *)0x0;
    }
    uVar6 = (ulong)pmVar7->_used >> 5;
  }
  arr_00 = (mpt_buffer *)0x0;
  pmVar11 = pmVar7;
  do {
    lVar10 = 1 - uVar6;
    pmVar3 = (mpt_identifier *)&pmVar11[1]._size;
    while( true ) {
      id = pmVar3;
      if (lVar10 + 1 == 2) {
        if (arr_00 == (mpt_buffer *)0x0) {
          if (pmVar7 == (mpt_buffer *)0x0) {
            pmVar7 = _mpt_buffer_alloc(0x20,2);
            if (pmVar7 == (mpt_buffer *)0x0) {
              return (mpt_config_item *)0x0;
            }
            pmVar7->_content_traits = pmVar5;
            pmVar7->_used = 0x20;
            ((mpt_buffer *)arr)->_vptr = (_mpt_vptr_buffer *)pmVar7;
            arr = (mpt_array *)(pmVar7 + 1);
          }
          else {
            arr = (mpt_array *)mpt_array_insert(arr,(size_t)pmVar7->_used,0x20);
            if ((mpt_buffer *)arr == (mpt_buffer *)0x0) {
              return (mpt_config_item *)0x0;
            }
          }
          (*pmVar5->init)(arr,(void *)0x0);
        }
        else {
          if (arr_00->_content_traits != (mpt_type_traits *)0x0) {
            (**(code **)(arr_00->_content_traits->init + 8))();
            arr_00->_content_traits = (mpt_type_traits *)0x0;
          }
          arr = (mpt_array *)arr_00;
          if ((mpt_buffer *)arr_00->_vptr != (mpt_buffer *)0x0) {
            mpt_buffer_cut((mpt_buffer *)arr_00->_vptr,0,(size_t)pmVar7->_used);
            mpt_array_reduce((mpt_array *)arr_00);
          }
        }
        pvVar8 = mpt_identifier_set((mpt_identifier *)&((mpt_buffer *)arr)->_size,pcVar1 + sVar2,len
                                   );
        if (pvVar8 == (void *)0x0) {
          return (mpt_config_item *)0x0;
        }
        if (path->len == 0) {
          return (mpt_config_item *)(mpt_buffer *)arr;
        }
        goto LAB_0010c190;
      }
      if (id->_len == 0) break;
      iVar4 = mpt_identifier_compare(id,pcVar1 + sVar2,len);
      lVar10 = lVar10 + 1;
      pmVar3 = id + 2;
      if (iVar4 == 0) {
        arr = (mpt_array *)(id + -1);
        if (path->len == 0) {
          return (mpt_config_item *)(id + -1);
        }
        goto LAB_0010c190;
      }
    }
    pmVar11 = (mpt_buffer *)(id + -1);
    if (arr_00 == (mpt_buffer *)0x0) {
      arr_00 = pmVar11;
    }
    uVar6 = -lVar10;
  } while( true );
}

Assistant:

extern MPT_STRUCT(config_item) *mpt_config_item_reserve(_MPT_UARRAY_TYPE(MPT_STRUCT(config_item)) *arr, MPT_STRUCT(path) *path)
{
	const MPT_STRUCT(type_traits) *traits;
	const MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(config_item) *item, *unused;
	const char *name;
	size_t item_count = 0;
	int len;
	
	name = path->base + path->off;
	if ((len = mpt_path_next(path)) < 0) {
		return 0;
	}
	traits = mpt_config_item_traits();
	if ((buf = arr->_buf)) {
		if (buf->_content_traits != traits) {
			errno = EINVAL;
			return 0;
		}
		item_count = buf->_used / sizeof(*item);
	}
	item = (MPT_STRUCT(config_item) *) (buf + 1);
	unused = 0;
	while (item_count--) {
		if (item->identifier._len == 0) {
			if (!unused) {
				unused = item;
			}
			++item;
			continue;
		}
		if (mpt_identifier_compare(&item->identifier, name, len) != 0) {
			++item;
			continue;
		}
		if (path->len) {
			return mpt_config_item_reserve(&item->elements, path);
		}
		return item;
	}
	if (!unused) {
		/* create initial buffer with unique array flags */
		if (!buf) {
			MPT_STRUCT(buffer) *b;
			if (!(b = _mpt_buffer_alloc(sizeof(*item), MPT_ENUM(BufferNoCopy)))) {
				return 0;
			}
			unused = (MPT_STRUCT(config_item) *) (b + 1);
			b->_content_traits = traits;
			b->_used = sizeof(*item);
			arr->_buf = b;
		}
		else if (!(unused = mpt_array_insert(arr, buf->_used, sizeof(*unused)))) {
			return 0;
		}
		traits->init(unused, 0);
	}
	else {
		MPT_INTERFACE(metatype) *old;
		MPT_STRUCT(buffer) *sub;
		if ((old = unused->value)) {
			old->_vptr->unref(old);
			unused->value = 0;
		}
		if ((sub = unused->elements._buf)) {
			mpt_buffer_cut(sub, 0, buf->_used);
			mpt_array_reduce(&unused->elements);
		}
	}
	if (!mpt_identifier_set(&unused->identifier, name, len)) {
		return 0;
	}
	if (path->len) {
		return mpt_config_item_reserve(&unused->elements, path);
	}
	return unused;
}